

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBar::setIconSize(QToolBar *this,QSize *iconSize)

{
  long lVar1;
  bool bVar2;
  QToolBarPrivate *this_00;
  QMainWindow *pQVar3;
  QLayout *pQVar4;
  long *plVar5;
  long lVar6;
  QStyle *pQVar7;
  QSize *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int metric;
  QLayoutItem *item;
  int i;
  QLayout *layout;
  QMainWindow *mw;
  QToolBarPrivate *d;
  QSize sz;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  long lVar8;
  QSize local_20;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = in_RDI;
  this_00 = d_func((QToolBar *)0x6eae5f);
  local_10 = *in_RSI;
  bVar2 = QSize::isValid((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (!bVar2) {
    QWidget::parentWidget((QWidget *)0x6eae99);
    pQVar3 = qobject_cast<QMainWindow*>((QObject *)0x6eaea1);
    if ((pQVar3 != (QMainWindow *)0x0) &&
       (pQVar4 = QWidget::layout((QWidget *)0x6eaebc), pQVar4 != (QLayout *)0x0)) {
      pQVar4 = QWidget::layout((QWidget *)0x6eaed0);
      do {
        plVar5 = (long *)(**(code **)(*(long *)pQVar4 + 0xa8))();
        if ((plVar5 != (long *)0x0) && (lVar6 = (**(code **)(*plVar5 + 0x68))(), lVar6 == in_RDI)) {
          local_10 = QMainWindow::iconSize
                               ((QMainWindow *)
                                CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
        }
        bVar2 = QSize::isValid((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ));
        in_stack_ffffffffffffff97 = !bVar2 && plVar5 != (long *)0x0;
      } while ((bool)in_stack_ffffffffffffff97);
    }
  }
  bVar2 = QSize::isValid((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (!bVar2) {
    pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                           );
    in_stack_ffffffffffffffa4 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x3b,0,in_RDI);
    QSize::QSize((QSize *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    local_10 = local_20;
  }
  bVar2 = ::operator!=((QSize *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       (QSize *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (bVar2) {
    this_00->iconSize = local_10;
    QWidget::setMinimumSize((QWidget *)this_00,(int)((ulong)lVar8 >> 0x20),(int)lVar8);
    iconSizeChanged((QToolBar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                    (QSize *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  bVar2 = QSize::isValid((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  (this_00->super_QWidgetPrivate).field_0x254 = bVar2;
  (**(code **)(*(long *)&this_00->layout->super_QLayout + 0x70))();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::setIconSize(const QSize &iconSize)
{
    Q_D(QToolBar);
    QSize sz = iconSize;
    if (!sz.isValid()) {
        QMainWindow *mw = qobject_cast<QMainWindow *>(parentWidget());
        if (mw && mw->layout()) {
            QLayout *layout = mw->layout();
            int i = 0;
            QLayoutItem *item = nullptr;
            do {
                item = layout->itemAt(i++);
                if (item && (item->widget() == this))
                    sz = mw->iconSize();
            } while (!sz.isValid() && item != nullptr);
        }
    }
    if (!sz.isValid()) {
        const int metric = style()->pixelMetric(QStyle::PM_ToolBarIconSize, nullptr, this);
        sz = QSize(metric, metric);
    }
    if (d->iconSize != sz) {
        d->iconSize = sz;
        setMinimumSize(0, 0);
        emit iconSizeChanged(d->iconSize);
    }
    d->explicitIconSize = iconSize.isValid();

    d->layout->invalidate();
}